

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

void __thiscall
glu::TextureCube::TextureCube
          (TextureCube *this,RenderContext *context,deUint32 format,deUint32 dataType,int size)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  Functions *gl;
  int local_24;
  deUint32 local_20;
  int size_local;
  deUint32 dataType_local;
  deUint32 format_local;
  RenderContext *context_local;
  TextureCube *this_local;
  
  this->m_context = context;
  this->m_isCompressed = false;
  this->m_format = format;
  local_24 = size;
  local_20 = dataType;
  size_local = format;
  _dataType_local = context;
  context_local = (RenderContext *)this;
  register0x00000000 = mapGLTransferFormat(format,dataType);
  tcu::TextureCube::TextureCube(&this->m_refTexture,(TextureFormat *)((long)&gl + 4),local_24);
  this->m_glTexture = 0;
  iVar1 = (*this->m_context->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6f8))(1,&this->m_glTexture);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  checkError(err,"glGenTextures() failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x167);
  return;
}

Assistant:

TextureCube::TextureCube (const RenderContext& context, deUint32 format, deUint32 dataType, int size)
	: m_context			(context)
	, m_isCompressed	(false)
	, m_format			(format)
	, m_refTexture		(mapGLTransferFormat(format, dataType), size)
	, m_glTexture		(0)
{
	const glw::Functions& gl = m_context.getFunctions();
	gl.genTextures(1, &m_glTexture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed");
}